

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.h
# Opt level: O3

LPCWSTR WScriptJsrt::ConvertErrorCodeToMessage(JsErrorCode errorCode)

{
  bool bVar1;
  byte bVar2;
  byte *pbVar3;
  char *in_RCX;
  ulong _SizeInBytes;
  byte *_Src;
  char *in_RSI;
  byte *pbVar4;
  undefined4 in_register_0000003c;
  ulong in_R8;
  char *in_R9;
  byte *_Src_00;
  byte *pbVar5;
  uint uVar6;
  byte *_Src_01;
  ulong unaff_retaddr;
  char *in_stack_00000008;
  ulong in_stack_00000010;
  
  _Src_01 = (byte *)CONCAT44(in_register_0000003c,errorCode);
  if ((int)errorCode < 0x20001) {
    _Src_01 = (byte *)(ulong)(errorCode - JsErrorInvalidArgument);
    if (errorCode - JsErrorInvalidArgument < 0xc) {
      in_RCX = (char *)((long)&switchD_00112feb::switchdataD_00165a78 +
                       (long)(int)(&switchD_00112feb::switchdataD_00165a78)[(long)_Src_01]);
      switch(_Src_01) {
      case (byte *)0x0:
        return L"TypeError: InvalidArgument";
      case (byte *)0x1:
        return L"TypeError: NullArgument";
      case (byte *)0x3:
        return L"ErrorInExceptionState";
      case (byte *)0x7:
        return L"ErrorBadSerializedScript ";
      case (byte *)0xb:
        return L"TypeError: ArgumentNotAnObject";
      }
    }
  }
  else if ((int)errorCode < 0x30002) {
    if (errorCode == JsErrorOutOfMemory) {
      return L"OutOfMemory";
    }
    if (errorCode == JsErrorScriptException) {
      return L"ScriptError";
    }
  }
  else {
    if (errorCode == JsErrorScriptCompile) {
      return L"SyntaxError";
    }
    if (errorCode == JsErrorFatal) {
      return L"FatalError";
    }
  }
  ConvertErrorCodeToMessage();
  if (_Src_01 == (byte *)0x0) {
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    uVar6 = 0x16;
    goto LAB_001131ab;
  }
  if ((in_RSI != (char *)0x0 || _SizeInBytes == 0) && (in_RSI == (char *)0x0 || _SizeInBytes != 0))
  {
    if ((in_RCX == (char *)0x0 && in_R8 != 0) ||
       ((((in_RCX != (char *)0x0 && in_R8 == 0 || (in_R9 == (char *)0x0 && unaff_retaddr != 0)) ||
         (in_R9 != (char *)0x0 && unaff_retaddr == 0)) ||
        ((in_stack_00000008 == (char *)0x0 && in_stack_00000010 != 0 ||
         (in_stack_00000008 != (char *)0x0 && in_stack_00000010 == 0)))))) {
      bVar1 = false;
      goto LAB_00113220;
    }
    bVar2 = *_Src_01;
    if (bVar2 == 0x5c) {
      if ((_Src_01[1] == 0x5c) && (_Src_01[2] == 0x3f)) {
        _Src_01 = _Src_01 + (ulong)(_Src_01[3] == 0x5c) * 4;
        bVar2 = *_Src_01;
        goto LAB_00113298;
      }
LAB_0011329c:
      if (_Src_01[1] == 0x3a) {
        if (in_RSI != (char *)0x0) {
          bVar1 = true;
          if (_SizeInBytes < 3) goto LAB_00113220;
          strncpy_s(in_RSI,_SizeInBytes,(char *)_Src_01,2);
        }
        _Src_01 = _Src_01 + 2;
        goto LAB_00113325;
      }
    }
    else {
LAB_00113298:
      if (bVar2 != 0) goto LAB_0011329c;
    }
    if ((in_RSI != (char *)0x0) && (*in_RSI = '\0', 1 < _SizeInBytes)) {
      memset(in_RSI + 1,0xfd,_SizeInBytes - 1);
    }
LAB_00113325:
    _Src = (byte *)0x0;
    pbVar3 = _Src_01;
    pbVar4 = _Src_01;
    _Src_00 = (byte *)0x0;
    do {
      bVar2 = *pbVar3;
      pbVar5 = _Src_00;
      if (bVar2 < 0x2f) {
        pbVar5 = pbVar3;
        if ((bVar2 != 0x2e) && (pbVar5 = _Src_00, bVar2 == 0)) goto LAB_0011335b;
      }
      else if ((bVar2 == 0x5c) || (bVar2 == 0x2f)) {
        _Src = pbVar3 + 1;
      }
      pbVar3 = pbVar3 + 1;
      pbVar4 = pbVar4 + 1;
      _Src_00 = pbVar5;
    } while( true );
  }
  bVar1 = false;
LAB_001130c2:
  if ((in_R8 != 0 && in_RCX != (char *)0x0) && (*in_RCX = '\0', 1 < in_R8)) {
    memset(in_RCX + 1,0xfd,in_R8 - 1);
  }
  if ((unaff_retaddr != 0 && in_R9 != (char *)0x0) && (*in_R9 = '\0', 1 < unaff_retaddr)) {
    memset(in_R9 + 1,0xfd,unaff_retaddr - 1);
  }
  if ((in_stack_00000010 != 0 && in_stack_00000008 != (char *)0x0) &&
     (*in_stack_00000008 = '\0', 1 < in_stack_00000010)) {
    memset(in_stack_00000008 + 1,0xfd,in_stack_00000010 - 1);
  }
  RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  uVar6 = 0x16;
  if (bVar1) {
    uVar6 = 0x22;
  }
LAB_001131ab:
  return (LPCWSTR)(ulong)uVar6;
LAB_0011335b:
  if (_Src == (byte *)0x0) {
    _Src = _Src_01;
    if ((in_RCX != (char *)0x0) && (*in_RCX = '\0', 1 < in_R8)) {
      memset(in_RCX + 1,0xfd,in_R8 - 1);
    }
LAB_0011340c:
    if (_Src_00 < _Src || _Src_00 == (byte *)0x0) {
      if (in_R9 != (char *)0x0) {
        bVar1 = true;
        if (unaff_retaddr <= (ulong)((long)pbVar4 - (long)_Src)) goto LAB_00113220;
        strncpy_s(in_R9,unaff_retaddr,(char *)_Src,(long)pbVar4 - (long)_Src);
      }
      uVar6 = 0;
      if ((in_stack_00000008 != (char *)0x0) &&
         (*in_stack_00000008 = '\0', uVar6 = 0, 1 < in_stack_00000010)) {
        memset(in_stack_00000008 + 1,0xfd,in_stack_00000010 - 1);
      }
      goto LAB_001131ab;
    }
    if (in_R9 != (char *)0x0) {
      bVar1 = true;
      if (unaff_retaddr <= (ulong)((long)_Src_00 - (long)_Src)) goto LAB_00113220;
      strncpy_s(in_R9,unaff_retaddr,(char *)_Src,(long)_Src_00 - (long)_Src);
    }
    uVar6 = 0;
    if (in_stack_00000008 == (char *)0x0) goto LAB_001131ab;
    bVar1 = true;
    if ((ulong)((long)pbVar4 - (long)_Src_00) < in_stack_00000010) {
      strncpy_s(in_stack_00000008,in_stack_00000010,(char *)_Src_00,(long)pbVar4 - (long)_Src_00);
      goto LAB_001131ab;
    }
  }
  else {
    if (in_RCX == (char *)0x0) goto LAB_0011340c;
    bVar1 = true;
    if ((ulong)((long)_Src - (long)_Src_01) < in_R8) {
      strncpy_s(in_RCX,in_R8,(char *)_Src_01,(long)_Src - (long)_Src_01);
      goto LAB_0011340c;
    }
  }
LAB_00113220:
  if ((_SizeInBytes != 0 && in_RSI != (char *)0x0) && (*in_RSI = '\0', 1 < _SizeInBytes)) {
    memset(in_RSI + 1,0xfd,_SizeInBytes - 1);
  }
  goto LAB_001130c2;
}

Assistant:

static LPCWSTR ConvertErrorCodeToMessage(JsErrorCode errorCode)
    {
        switch (errorCode)
        {
        case (JsErrorCode::JsErrorInvalidArgument) :
            return _u("TypeError: InvalidArgument");
        case (JsErrorCode::JsErrorNullArgument) :
            return _u("TypeError: NullArgument");
        case (JsErrorCode::JsErrorArgumentNotObject) :
            return _u("TypeError: ArgumentNotAnObject");
        case (JsErrorCode::JsErrorOutOfMemory) :
            return _u("OutOfMemory");
        case (JsErrorCode::JsErrorScriptException) :
            return _u("ScriptError");
        case (JsErrorCode::JsErrorScriptCompile) :
            return _u("SyntaxError");
        case (JsErrorCode::JsErrorFatal) :
            return _u("FatalError");
        case (JsErrorCode::JsErrorInExceptionState) :
            return _u("ErrorInExceptionState");
        case (JsErrorCode::JsErrorBadSerializedScript):
            return _u("ErrorBadSerializedScript ");
        default:
            AssertMsg(false, "Unexpected JsErrorCode");
            return nullptr;
        }
    }